

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cpp
# Opt level: O3

string * miniros::names::resolve(string *__return_storage_ptr__,string *ns,string *name,bool _remap)

{
  size_type sVar1;
  pointer pcVar2;
  char *pcVar3;
  bool bVar4;
  char cVar5;
  string *left;
  runtime_error *this;
  string error;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  bVar4 = validate(name,&local_70);
  if (!bVar4) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,(string *)&local_70);
    *(undefined ***)this = &PTR__runtime_error_002aadd8;
    __cxa_throw(this,&InvalidNameException::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar1 = name->_M_string_length;
  if (sVar1 == 0) {
    sVar1 = ns->_M_string_length;
    if (sVar1 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      *(undefined2 *)&__return_storage_ptr__->field_2 = 0x2f;
      __return_storage_ptr__->_M_string_length = 1;
      goto LAB_001e683f;
    }
    pcVar3 = (ns->_M_dataplus)._M_p;
    if (*pcVar3 == '/') {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar3,pcVar3 + sVar1);
      goto LAB_001e683f;
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0.field_2._M_allocated_capacity._0_2_ = 0x2f;
    local_b0._M_string_length = 1;
    append(__return_storage_ptr__,&local_b0,ns);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + sVar1);
    cVar5 = *(__return_storage_ptr__->_M_dataplus)._M_p;
    if (cVar5 == '~') {
      left = this_node::getName_abi_cxx11_();
      std::__cxx11::string::substr((ulong)&local_90,(ulong)__return_storage_ptr__);
      append(&local_b0,left,&local_90);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,
                        CONCAT62(local_b0.field_2._M_allocated_capacity._2_6_,
                                 local_b0.field_2._M_allocated_capacity._0_2_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,
                        CONCAT62(local_90.field_2._M_allocated_capacity._2_6_,
                                 local_90.field_2._M_allocated_capacity._0_2_) + 1);
      }
      cVar5 = *(__return_storage_ptr__->_M_dataplus)._M_p;
    }
    if (cVar5 != '/') {
      local_90.field_2._M_allocated_capacity._0_2_ = 0x2f;
      local_90._M_string_length = 1;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      append(&local_50,ns,__return_storage_ptr__);
      append(&local_b0,&local_90,&local_50);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,
                        CONCAT62(local_b0.field_2._M_allocated_capacity._2_6_,
                                 local_b0.field_2._M_allocated_capacity._0_2_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,
                        CONCAT62(local_90.field_2._M_allocated_capacity._2_6_,
                                 local_90.field_2._M_allocated_capacity._0_2_) + 1);
      }
    }
    clean(&local_b0,__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,
                      CONCAT62(local_b0.field_2._M_allocated_capacity._2_6_,
                               local_b0.field_2._M_allocated_capacity._0_2_) + 1);
    }
    if (!_remap) goto LAB_001e683f;
    remap(&local_b0,__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT62(local_b0.field_2._M_allocated_capacity._2_6_,
                             local_b0.field_2._M_allocated_capacity._0_2_) + 1);
  }
LAB_001e683f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string resolve(const std::string& ns, const std::string& name, bool _remap)
{
  std::string error;
  if (!validate(name, error))
  {
    throw InvalidNameException(error);
  }

  if (name.empty())
  {
    if (ns.empty())
    {
      return "/";
    }

    if (ns[0] == '/')
    {
      return ns;
    }

    return append("/", ns);
  }

  std::string copy = name;

  if (copy[0] == '~')
  {
    copy = append(this_node::getName(), copy.substr(1));
  }

  if (copy[0] != '/')
  {
    copy = append("/", append(ns, copy));
  }

  copy = clean(copy);

  if (_remap)
  {
    copy = remap(copy);
  }

  return copy;
}